

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O0

bool efsw::FileInfo::exists(string *filePath)

{
  bool bVar1;
  undefined1 local_58 [8];
  FileInfo fi;
  string *filePath_local;
  
  fi.Inode = (Uint64)filePath;
  FileInfo((FileInfo *)local_58,filePath);
  bVar1 = exists((FileInfo *)local_58);
  ~FileInfo((FileInfo *)local_58);
  return bVar1;
}

Assistant:

bool FileInfo::exists( const std::string& filePath ) {
	FileInfo fi( filePath );
	return fi.exists();
}